

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

char * sx_os_path_relpath(char *dst,int size,char *path,char *start)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  if (start == dst) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x263
                      ,"start != dst");
    pcVar1 = (code *)swi(3);
    pcVar4 = (char *)(*pcVar1)();
    return pcVar4;
  }
  pcVar4 = sx_strstr(path,start);
  if (pcVar4 == (char *)0x0) {
    dst = (char *)0x0;
  }
  else {
    uVar2 = sx_strlen(start);
    if ((0 < (int)uVar2) && ((pcVar4[uVar2] == '\\' || (pcVar4[uVar2] == '/')))) {
      uVar2 = uVar2 + 1;
    }
    pcVar4 = pcVar4 + (int)uVar2;
    if (path == dst) {
      iVar3 = sx_strlen(pcVar4);
      pcVar4 = (char *)memmove(dst,pcVar4,(long)iVar3 + 1);
      return pcVar4;
    }
    sx_strcpy(dst,size,pcVar4);
  }
  return dst;
}

Assistant:

char* sx_os_path_relpath(char* dst, int size, const char* path, const char* start)
{
    sx_assert(start != dst);

    const char* sub = sx_strstr(path, start);
    if (sub) {
        int len = sx_strlen(start);
        if (len > 0 && (sub[len] == '/' || sub[len] == '\\'))
            len++;
        if (path != dst)
            sx_strcpy(dst, size, sub + len);
        else
            sx_memmove(dst, sub + len, (size_t)sx_strlen(sub + len) + 1);
        return dst;
    }
    return NULL;
}